

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O1

void __thiscall ipx::Iterate::make_fixed(Iterate *this,Int j)

{
  (this->xl_)._M_data[j] = 0.0;
  (this->xu_)._M_data[j] = 0.0;
  (this->zl_)._M_data[j] = 0.0;
  (this->zu_)._M_data[j] = 0.0;
  (this->variable_state_).
  super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>._M_impl.
  super__Vector_impl_data._M_start[j] = FIXED;
  this->evaluated_ = false;
  return;
}

Assistant:

void Iterate::make_fixed(Int j) {
    xl_[j] = 0.0;
    xu_[j] = 0.0;
    zl_[j] = 0.0;
    zu_[j] = 0.0;
    variable_state_[j] = StateDetail::FIXED;
    evaluated_ = false;
}